

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O0

void __thiscall mocker::SSADestruction::sequentializeParallelCopies(SSADestruction *this)

{
  FunctionModule *hint;
  __node_base_ptr p_Var1;
  bool bVar2;
  BasicBlockList *this_00;
  mapped_type *this_01;
  element_type *peVar3;
  string *psVar4;
  mapped_type *pmVar5;
  shared_ptr<mocker::ir::Reg> *psVar6;
  pointer ppVar7;
  shared_ptr<mocker::ir::Reg> local_170;
  shared_ptr<mocker::ir::IRInst> local_160;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
  local_150;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
  local_148;
  iterator iter;
  shared_ptr<mocker::ir::Reg> p;
  shared_ptr<mocker::ir::Addr> newVal;
  shared_ptr<mocker::ir::IRInst> local_110;
  undefined1 local_100 [8];
  mapped_type addr;
  string local_e8 [32];
  undefined1 local_c8 [24];
  shared_ptr<mocker::ir::Reg> oldVal;
  Copy *pcopy;
  const_iterator __end2;
  const_iterator __begin2;
  mapped_type *__range2;
  size_t local_78;
  mapped_type *local_70;
  mapped_type *pcopies;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
  regHoldingOldValue;
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  BasicBlockList *__range1;
  SSADestruction *this_local;
  
  this_00 = ir::FunctionModule::getMutableBBs_abi_cxx11_((this->super_FuncPass).func);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(this_00);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (this_00);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&bb), bVar2) {
    regHoldingOldValue._M_h._M_single_bucket =
         (__node_base_ptr)std::_List_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                     *)&pcopies);
    local_78 = ir::BasicBlock::getLabelID((BasicBlock *)regHoldingOldValue._M_h._M_single_bucket);
    this_01 = std::
              unordered_map<unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>_>
              ::operator[](&this->parallelCopies,&stack0xffffffffffffff88);
    local_70 = this_01;
    __end2 = std::__cxx11::
             list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>::
             begin(this_01);
    pcopy = (Copy *)std::__cxx11::
                    list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>
                    ::end(this_01);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&pcopy), bVar2) {
      oldVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_const_iterator<mocker::SSADestruction::Copy>::operator*(&__end2);
      hint = (this->super_FuncPass).func;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_e8,"",
                 (allocator<char> *)
                 ((long)&addr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_c8,&hint->identifier);
      peVar3 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)oldVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
      psVar4 = ir::Reg::getIdentifier_abi_cxx11_(peVar3);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                             *)&pcopies,psVar4);
      psVar6 = std::shared_ptr<mocker::ir::Reg>::operator=
                         (pmVar5,(shared_ptr<mocker::ir::Reg> *)local_c8);
      std::shared_ptr<mocker::ir::Reg>::shared_ptr
                ((shared_ptr<mocker::ir::Reg> *)(local_c8 + 0x10),psVar6);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_c8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&addr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      peVar3 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)oldVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
      psVar4 = ir::Reg::getIdentifier_abi_cxx11_(peVar3);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
               ::at(&this->addresses,psVar4);
      std::shared_ptr<mocker::ir::Reg>::shared_ptr((shared_ptr<mocker::ir::Reg> *)local_100,pmVar5);
      p_Var1 = regHoldingOldValue._M_h._M_single_bucket;
      std::
      make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((shared_ptr<mocker::ir::Reg> *)
                 &newVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(shared_ptr<mocker::ir::Reg> *)(local_c8 + 0x10));
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Load,void>
                (&local_110,
                 (shared_ptr<mocker::ir::Load> *)
                 &newVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ir::BasicBlock::appendInstBeforeTerminator((BasicBlock *)p_Var1,&local_110);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_110);
      std::shared_ptr<mocker::ir::Load>::~shared_ptr
                ((shared_ptr<mocker::ir::Load> *)
                 &newVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<mocker::ir::Addr>::shared_ptr
                ((shared_ptr<mocker::ir::Addr> *)
                 &p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (shared_ptr<mocker::ir::Addr> *)
                 (oldVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi + 1));
      ir::dycLocalReg((ir *)&iter,
                      (shared_ptr<mocker::ir::Addr> *)
                      (oldVal.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 1));
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&iter);
      if (bVar2) {
        peVar3 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&iter);
        psVar4 = ir::Reg::getIdentifier_abi_cxx11_(peVar3);
        local_148._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                     *)&pcopies,psVar4);
        local_150._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                    *)&pcopies);
        bVar2 = std::__detail::operator!=(&local_148,&local_150);
        if (bVar2) {
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_false,_true>
                                 *)&local_148);
          std::shared_ptr<mocker::ir::Addr>::operator=
                    ((shared_ptr<mocker::ir::Addr> *)
                     &p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &ppVar7->second);
        }
      }
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)&iter);
      p_Var1 = regHoldingOldValue._M_h._M_single_bucket;
      std::
      make_shared<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
                (&local_170,(shared_ptr<mocker::ir::Addr> *)local_100);
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Store,void>
                (&local_160,(shared_ptr<mocker::ir::Store> *)&local_170);
      ir::BasicBlock::appendInstBeforeTerminator((BasicBlock *)p_Var1,&local_160);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_160);
      std::shared_ptr<mocker::ir::Store>::~shared_ptr((shared_ptr<mocker::ir::Store> *)&local_170);
      std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                ((shared_ptr<mocker::ir::Addr> *)
                 &p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_100);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr
                ((shared_ptr<mocker::ir::Reg> *)(local_c8 + 0x10));
      std::_List_const_iterator<mocker::SSADestruction::Copy>::operator++(&__end2);
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                      *)&pcopies);
    std::_List_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  }
  return;
}

Assistant:

void SSADestruction::sequentializeParallelCopies() {
  // We adopt a naive approach here: we first load the old values to temporary
  // registers and rename the later use. Then, for each Copy, we simply put a
  // Store.
  // Redundant Loads can be eliminate in later passes.

  for (auto &bb : func.getMutableBBs()) {
    std::unordered_map<std::string, std::shared_ptr<ir::Reg>>
        regHoldingOldValue;
    const auto &pcopies = parallelCopies[bb.getLabelID()];
    for (auto &pcopy : pcopies) {
      auto oldVal = regHoldingOldValue[pcopy.dest->getIdentifier()] =
          func.makeTempLocalReg();
      auto addr = addresses.at(pcopy.dest->getIdentifier());
      bb.appendInstBeforeTerminator(std::make_shared<ir::Load>(oldVal, addr));
      std::shared_ptr<ir::Addr> newVal = pcopy.val;
      if (auto p = ir::dycLocalReg(pcopy.val)) {
        auto iter = regHoldingOldValue.find(p->getIdentifier());
        if (iter != regHoldingOldValue.end())
          newVal = iter->second;
      }
      bb.appendInstBeforeTerminator(std::make_shared<ir::Store>(addr, newVal));
    }
  }
}